

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void sendNode<cpprofiler::Node&>(Node *node)

{
  char cVar1;
  
  if (so.print_nodes) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::ofstream::open(node_stream,0x1dd83c);
    }
    printNode<cpprofiler::Node&>(node,(ostream *)node_stream);
    if (so.debug == true) {
      printNode<cpprofiler::Node&>(node,(ostream *)&std::cerr);
    }
  }
  cpprofiler::Connector::sendNode(node->_c,node);
  return;
}

Assistant:

static void sendNode(T&& node) {
	if (so.print_nodes) {
		if (!node_stream.is_open()) {
			node_stream.open("node-log.log");
		}
		printNode(node, node_stream);
		if (so.debug) {
			printNode(node, std::cerr);
		}
	}
	node.send();
}